

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcAnalyzerResults.cpp
# Opt level: O0

void __thiscall
HdlcAnalyzerResults::GenFcsFieldString
          (HdlcAnalyzerResults *this,Frame *frame,DisplayBase display_base,bool tabular)

{
  HdlcFcsType HVar1;
  ostream *poVar2;
  char *pcVar3;
  string local_350 [32];
  string local_330 [32];
  string local_310 [32];
  string local_2f0 [48];
  stringstream local_2c0 [8];
  stringstream fieldNameStr;
  ostream local_2b0 [376];
  char local_138 [8];
  char calcFcsStr [128];
  char readFcsStr [128];
  char *local_30;
  char *crcTypeStr;
  U32 fcsBits;
  bool tabular_local;
  DisplayBase display_base_local;
  Frame *frame_local;
  HdlcAnalyzerResults *this_local;
  
  crcTypeStr._4_4_ = 0;
  local_30 = (char *)0x0;
  HVar1 = this->mSettings->mHdlcFcs;
  if (HVar1 == HDLC_CRC8) {
    crcTypeStr._4_4_ = 8;
    local_30 = "8 ";
  }
  else if (HVar1 == HDLC_CRC16) {
    crcTypeStr._4_4_ = 0x10;
    local_30 = "16";
  }
  else if (HVar1 == HDLC_CRC32) {
    crcTypeStr._4_4_ = 0x20;
    local_30 = "32";
  }
  AnalyzerHelpers::GetNumberString
            (*(ulonglong *)(frame + 0x10),display_base,crcTypeStr._4_4_,calcFcsStr + 0x78,0x80);
  AnalyzerHelpers::GetNumberString
            (*(ulonglong *)(frame + 0x18),display_base,crcTypeStr._4_4_,local_138,0x80);
  std::__cxx11::stringstream::stringstream(local_2c0);
  if (((byte)frame[0x21] & 0x80) != 0) {
    std::operator<<(local_2b0,"!");
  }
  poVar2 = std::operator<<(local_2b0,"FCS CRC");
  std::operator<<(poVar2,local_30);
  if (!tabular) {
    AnalyzerResults::AddResultString
              ((char *)this,"CRC",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    std::__cxx11::stringstream::str();
    pcVar3 = (char *)std::__cxx11::string::c_str();
    AnalyzerResults::AddResultString
              ((char *)this,pcVar3,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    std::__cxx11::string::~string(local_2f0);
  }
  if (((byte)frame[0x21] & 0x80) == 0) {
    std::operator<<(local_2b0," OK");
  }
  else {
    std::operator<<(local_2b0," ERROR");
  }
  if (!tabular) {
    std::__cxx11::stringstream::str();
    pcVar3 = (char *)std::__cxx11::string::c_str();
    AnalyzerResults::AddResultString
              ((char *)this,pcVar3,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    std::__cxx11::string::~string(local_310);
  }
  if (((byte)frame[0x21] & 0x80) != 0) {
    poVar2 = std::operator<<(local_2b0," - CALC CRC[");
    poVar2 = std::operator<<(poVar2,local_138);
    poVar2 = std::operator<<(poVar2,"] != READ CRC[");
    poVar2 = std::operator<<(poVar2,calcFcsStr + 0x78);
    std::operator<<(poVar2,"]");
  }
  if (tabular) {
    std::__cxx11::stringstream::str();
    pcVar3 = (char *)std::__cxx11::string::c_str();
    AnalyzerResults::AddTabularText
              ((char *)this,pcVar3,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    std::__cxx11::string::~string(local_350);
  }
  else {
    std::__cxx11::stringstream::str();
    pcVar3 = (char *)std::__cxx11::string::c_str();
    AnalyzerResults::AddResultString
              ((char *)this,pcVar3,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    std::__cxx11::string::~string(local_330);
  }
  std::__cxx11::stringstream::~stringstream(local_2c0);
  return;
}

Assistant:

void HdlcAnalyzerResults::GenFcsFieldString( const Frame& frame, DisplayBase display_base, bool tabular )
{
    U32 fcsBits = 0;
    char* crcTypeStr = 0;
    switch( mSettings->mHdlcFcs )
    {
    case HDLC_CRC8:
        fcsBits = 8;
        crcTypeStr = "8 ";
        break;
    case HDLC_CRC16:
        fcsBits = 16;
        crcTypeStr = "16";
        break;
    case HDLC_CRC32:
        fcsBits = 32;
        crcTypeStr = "32";
        break;
    }

    char readFcsStr[ 128 ];
    AnalyzerHelpers::GetNumberString( frame.mData1, display_base, fcsBits, readFcsStr, 128 );
    char calcFcsStr[ 128 ];
    AnalyzerHelpers::GetNumberString( frame.mData2, display_base, fcsBits, calcFcsStr, 128 );

    stringstream fieldNameStr;
    if( frame.mFlags & DISPLAY_AS_ERROR_FLAG )
    {
        fieldNameStr << "!";
    }

    fieldNameStr << "FCS CRC" << crcTypeStr;

    if( !tabular )
    {
        AddResultString( "CRC" );
        AddResultString( fieldNameStr.str().c_str() );
    }

    if( frame.mFlags & DISPLAY_AS_ERROR_FLAG )
    {
        fieldNameStr << " ERROR";
    }
    else
    {
        fieldNameStr << " OK";
    }

    if( !tabular )
    {
        AddResultString( fieldNameStr.str().c_str() );
    }

    if( frame.mFlags & DISPLAY_AS_ERROR_FLAG )
    {
        fieldNameStr << " - CALC CRC[" << calcFcsStr << "] != READ CRC[" << readFcsStr << "]";
    }

    if( !tabular )
        AddResultString( fieldNameStr.str().c_str() );
    else
        AddTabularText( fieldNameStr.str().c_str() );
}